

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_mvl.c
# Opt level: O2

void * MVL_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  void *opaque;
  void *pvVar2;
  PHYSFS_uint32 PVar3;
  uint uVar4;
  bool bVar5;
  PHYSFS_uint32 count;
  PHYSFS_uint32 size;
  PHYSFS_uint8 buf [4];
  char local_3d [12];
  undefined1 local_31;
  
  count = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_mvl.c"
                  ,0x3f,"void *MVL_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,buf,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if (buf == (PHYSFS_uint8  [4])0x4c564d44) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&count,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE32(count);
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      uVar4 = count * 0x11 + 8;
      PVar3 = count;
      while( true ) {
        bVar5 = PVar3 == 0;
        PVar3 = PVar3 - 1;
        if (bVar5) {
          return opaque;
        }
        iVar1 = __PHYSFS_readAll(io,local_3d,0xd);
        if ((iVar1 == 0) || (iVar1 = __PHYSFS_readAll(io,&size,4), iVar1 == 0)) break;
        local_31 = 0;
        size = PHYSFS_swapULE32(size);
        pvVar2 = UNPK_addEntry(opaque,local_3d,0,-1,-1,(ulong)uVar4,(ulong)size);
        if (pvVar2 == (void *)0x0) break;
        uVar4 = uVar4 + size;
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *MVL_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint32 count = 0;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */
    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, 4), NULL);
    BAIL_IF(memcmp(buf, "DMVL", 4) != 0, PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!mvlLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}